

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

uint * __thiscall
google::protobuf::RepeatedField<unsigned_int>::AddNAlreadyReserved
          (RepeatedField<unsigned_int> *this,int n)

{
  int iVar1;
  LogMessage *pLVar2;
  uint *puVar3;
  uint *ret;
  byte local_51;
  LogMessage local_50;
  int local_14;
  RepeatedField<unsigned_int> *pRStack_10;
  int n_local;
  RepeatedField<unsigned_int> *this_local;
  
  local_51 = 0;
  local_14 = n;
  pRStack_10 = this;
  if (this->total_size_ - this->current_size_ < n) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x268);
    local_51 = 1;
    pLVar2 = internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (total_size_ - current_size_) >= (n): ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,this->total_size_);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,", ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,this->current_size_);
    internal::LogFinisher::operator=((LogFinisher *)((long)&ret + 3),pLVar2);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  puVar3 = unsafe_elements(this);
  iVar1 = this->current_size_;
  this->current_size_ = local_14 + this->current_size_;
  return puVar3 + iVar1;
}

Assistant:

inline Element* RepeatedField<Element>::AddNAlreadyReserved(int n) {
  GOOGLE_DCHECK_GE(total_size_ - current_size_, n)
      << total_size_ << ", " << current_size_;
  // Warning: sometimes people call this when n == 0 and total_size_ == 0. In
  // this case the return pointer points to a zero size array (n == 0). Hence
  // we can just use unsafe_elements(), because the user cannot dereference the
  // pointer anyway.
  Element* ret = unsafe_elements() + current_size_;
  current_size_ += n;
  return ret;
}